

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.hpp
# Opt level: O3

void rc::showCollection<std::array<unsigned_long,4ul>>
               (string *prefix,string *suffix,array<unsigned_long,_4UL> *collection,ostream *os)

{
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  lVar1 = 8;
  do {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(suffix->_M_dataplus)._M_p,suffix->_M_string_length);
  return;
}

Assistant:

void showCollection(const std::string &prefix,
                    const std::string &suffix,
                    const Collection &collection,
                    std::ostream &os) {
  os << prefix;
  auto cbegin = begin(collection);
  auto cend = end(collection);
  if (cbegin != cend) {
    show(*cbegin, os);
    for (auto it = ++cbegin; it != cend; it++) {
      os << ", ";
      show(*it, os);
    }
  }
  os << suffix;
}